

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

AActor * P_OldSpawnMissile(AActor *source,AActor *owner,AActor *dest,PClassActor *type)

{
  PClassActor *dest_00;
  AActor *this;
  uint uVar1;
  double dVar2;
  double dVar3;
  TFlags<ActorFlag4,_unsigned_int> local_64;
  double local_60;
  double dist;
  DVector3 local_50;
  AActor *local_38;
  AActor *th;
  PClassActor *type_local;
  AActor *dest_local;
  AActor *owner_local;
  AActor *source_local;
  
  if ((source == (AActor *)0x0) || (type == (PClassActor *)0x0)) {
    source_local = (AActor *)0x0;
  }
  else {
    th = (AActor *)type;
    type_local = (PClassActor *)dest;
    dest_local = owner;
    owner_local = source;
    AActor::PosPlusZ(&local_50,source,32.0);
    local_38 = Spawn(type,&local_50,ALLOW_REPLACE);
    P_PlaySpawnSound(local_38,owner_local);
    TObjPtr<AActor>::operator=(&local_38->target,dest_local);
    AActor::AngleTo((AActor *)&dist,owner_local,SUB81(type_local,0));
    TAngle<double>::operator=(&(local_38->Angles).Yaw,(TAngle<double> *)&dist);
    AActor::VelFromAngle(local_38);
    this = owner_local;
    dest_00 = type_local;
    dVar2 = MAX<double>(1.0,local_38->Speed);
    local_60 = AActor::DistanceBySpeed(this,(AActor *)dest_00,dVar2);
    dVar2 = AActor::Z((AActor *)type_local);
    dVar3 = AActor::Z(owner_local);
    (local_38->Vel).Z = (dVar2 - dVar3) / local_60;
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_64,
               (int)local_38 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH)
              );
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_64);
    if (uVar1 != 0) {
      AActor::SetFriendPlayer(local_38,dest_local->player);
    }
    P_CheckMissileSpawn(local_38,owner_local->radius);
    source_local = local_38;
  }
  return source_local;
}

Assistant:

AActor *P_OldSpawnMissile(AActor *source, AActor *owner, AActor *dest, PClassActor *type)
{
	if (source == nullptr || type == nullptr)
	{
		return nullptr;
	}
	AActor *th = Spawn (type, source->PosPlusZ(32.), ALLOW_REPLACE);

	P_PlaySpawnSound(th, source);
	th->target = owner;		// record missile's originator

	th->Angles.Yaw = source->AngleTo(dest);
	th->VelFromAngle();


	double dist = source->DistanceBySpeed(dest, MAX(1., th->Speed));
	th->Vel.Z = (dest->Z() - source->Z()) / dist;

	if (th->flags4 & MF4_SPECTRAL)
	{
		th->SetFriendPlayer(owner->player);
	}

	P_CheckMissileSpawn(th, source->radius);
	return th;
}